

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strtou32_base
          (numbers_internal *this,string_view text,Nonnull<uint32_t_*> value,int base)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool local_1d;
  uint local_1c;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (char *)text._M_len;
  local_1c = (uint)value;
  *(uint *)text._M_str = 0;
  local_18._M_len = (size_t)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_18,(Nonnull<int_*>)&local_1c,&local_1d);
  if ((bVar1) && (local_1d == false)) {
    if ((long)(int)local_1c < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3da,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned int]"
                   );
    }
    if ((1 < local_1c) &&
       ((uint)(0xffffffff / (ulong)local_1c) !=
        *(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                 (long)(int)local_1c * 4))) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3df,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned int]"
                   );
    }
    local_18._M_len = local_18._M_len + (long)local_18._M_str;
    uVar3 = 0;
    while( true ) {
      bVar1 = local_18._M_len <= local_18._M_str;
      if ((bVar1) ||
         (uVar4 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18._M_str],
         local_1c <= uVar4)) goto LAB_00242c6d;
      if ((*(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                    (long)(int)local_1c * 4) < uVar3) ||
         (uVar2 = uVar3 * local_1c, uVar3 = uVar2 + uVar4, CARRY4(uVar2,uVar4))) break;
      local_18._M_str = (char *)((numbers_internal *)local_18._M_str + 1);
    }
    uVar3 = 0xffffffff;
LAB_00242c6d:
    *(uint *)text._M_str = uVar3;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, absl::Nonnull<uint32_t*> value,
                        int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}